

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

int64_t pick_wedge_fixed_sign
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int16_t *residual1,int16_t *diff10,
                  int8_t wedge_sign,int8_t *best_wedge_index,uint64_t *best_sse)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  uint uVar4;
  long lVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  undefined7 in_register_00000089;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int64_t *in_stack_ffffffffffffff60;
  int rate;
  uint local_90;
  int local_8c;
  ulong local_88;
  char *local_80;
  int16_t *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long *local_50;
  int16_t *local_48;
  int16_t *local_40;
  int64_t dist;
  
  local_80 = (char *)CONCAT71(in_register_00000089,wedge_sign);
  local_48 = (int16_t *)CONCAT71(in_register_00000011,bsize);
  uVar6 = (uint)x;
  local_88 = (ulong)x & 0xffffffff;
  bVar1 = block_size_wide[local_88];
  bVar2 = block_size_high[local_88];
  uVar4 = 0;
  if ((*(byte *)(*(long *)((cpi->enc_quant_dequant_params).quants.y_zbin[10] + 4) + 0xc0) & 8) != 0)
  {
    uVar4 = *(int *)(cpi->enc_quant_dequant_params).quants.y_zbin[0xb3] * 2 - 0x10;
  }
  local_8c = (int)(char)*(undefined4 *)
                         ((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uVar6 << 5));
  local_50 = (long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uVar6 << 5));
  local_60 = (long)((1 << ((byte)uVar4 & 0x1f)) >> 1);
  local_68 = (ulong)uVar4;
  local_78 = (cpi->enc_quant_dequant_params).quants.u_round_fp[0x30] + 4;
  lVar8 = 0x7fffffffffffffff;
  local_58 = (long)(char)diff10 << 7;
  local_90 = uVar6 & 0xff;
  local_70 = (ulong)(uVar6 << 6) + (long)local_78;
  local_40 = residual1;
  for (cVar9 = '\0'; cVar9 < local_8c; cVar9 = cVar9 + '\x01') {
    uVar3 = (*av1_wedge_sse_from_residuals)
                      (local_48,local_40,*(uint8_t **)(*local_50 + local_58 + (long)cVar9 * 8),
                       (uint)bVar2 * (uint)bVar1);
    uVar7 = uVar3 + local_60 >> ((byte)local_68 & 0x3f);
    model_rd_with_curvfit
              (cpi,(MACROBLOCK *)(ulong)local_90,BLOCK_4X4,(int)uVar7,
               (ulong)((uint)bVar2 * (uint)bVar1),(int)&rate,(int *)&dist,in_stack_ffffffffffffff60)
    ;
    lVar5 = (long)rate + (long)*(int *)(local_70 + (long)cVar9 * 4);
    rate = (int)lVar5;
    lVar5 = dist * 0x80 +
            (*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) * lVar5 + 0x100
            >> 9);
    if (lVar5 < lVar8) {
      *local_80 = cVar9;
      *(ulong *)best_wedge_index = uVar7;
      lVar8 = lVar5;
    }
  }
  return lVar8 - ((long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) *
                  (long)*(int *)((long)local_78 +
                                (long)*local_80 * 4 + (ulong)(uint)((int)local_88 << 6)) + 0x100 >>
                 9);
}

Assistant:

static int64_t pick_wedge_fixed_sign(
    const AV1_COMP *const cpi, const MACROBLOCK *const x,
    const BLOCK_SIZE bsize, const int16_t *const residual1,
    const int16_t *const diff10, const int8_t wedge_sign,
    int8_t *const best_wedge_index, uint64_t *best_sse) {
  const MACROBLOCKD *const xd = &x->e_mbd;

  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = bw * bh;
  assert(N >= 64);
  int rate;
  int64_t dist;
  int64_t rd, best_rd = INT64_MAX;
  int8_t wedge_index;
  const int8_t wedge_types = get_wedge_types_lookup(bsize);
  const uint8_t *mask;
  uint64_t sse;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  for (wedge_index = 0; wedge_index < wedge_types; ++wedge_index) {
    mask = av1_get_contiguous_soft_mask(wedge_index, wedge_sign, bsize);
    sse = av1_wedge_sse_from_residuals(residual1, diff10, mask, N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    rate += x->mode_costs.wedge_idx_cost[bsize][wedge_index];
    rd = RDCOST(x->rdmult, rate, dist);

    if (rd < best_rd) {
      *best_wedge_index = wedge_index;
      best_rd = rd;
      *best_sse = sse;
    }
  }
  return best_rd -
         RDCOST(x->rdmult,
                x->mode_costs.wedge_idx_cost[bsize][*best_wedge_index], 0);
}